

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::InstrumentPass::GetUintId(InstrumentPass *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  Type *type;
  Type *reg_uint_ty;
  Integer uint_ty;
  TypeManager *type_mgr;
  InstrumentPass *this_local;
  
  if (this->uint_id_ == 0) {
    this_00 = Pass::context(&this->super_Pass);
    uint_ty._40_8_ = IRContext::get_type_mgr(this_00);
    analysis::Integer::Integer((Integer *)&reg_uint_ty,0x20,false);
    type = analysis::TypeManager::GetRegisteredType
                     ((TypeManager *)uint_ty._40_8_,(Type *)&reg_uint_ty);
    uVar1 = analysis::TypeManager::GetTypeInstruction((TypeManager *)uint_ty._40_8_,type);
    this->uint_id_ = uVar1;
    analysis::Integer::~Integer((Integer *)&reg_uint_ty);
  }
  return this->uint_id_;
}

Assistant:

uint32_t InstrumentPass::GetUintId() {
  if (uint_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Integer uint_ty(32, false);
    analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
    uint_id_ = type_mgr->GetTypeInstruction(reg_uint_ty);
  }
  return uint_id_;
}